

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManExploreCut(Sbd_Man_t *p,int Pivot,int nLeaves,int *pLeaves,int *pnStrs,Sbd_Str_t *Strs,
                     int *pFreeVar)

{
  sat_solver *psVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  abctime aVar7;
  word wVar8;
  abctime aVar9;
  Sbd_Par_t *pSVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  Vec_Int_t *pVVar18;
  int *piVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  int pNodesBot [10];
  int pNodesTop [10];
  int pNodesBot1 [10];
  int pNodesBot2 [10];
  
  Abc_Clock();
  iVar3 = Vec_IntEntry(p->vObj2Var,Pivot);
  iVar4 = Vec_IntEntry(p->vLutLevs,Pivot);
  uVar6 = 0;
  if (0 < nLeaves) {
    uVar6 = (ulong)(uint)nLeaves;
  }
  uVar16 = nLeaves - 1;
  for (uVar14 = 0; p->vDivSet->nSize = 0, uVar14 != uVar6; uVar14 = uVar14 + 1) {
    iVar13 = ~(uint)uVar14 + nLeaves;
    for (uVar21 = 0; (uint)nLeaves != uVar21; uVar21 = uVar21 + 1) {
      if ((uVar16 != uVar21) && (pLeaves[uVar21] != -1)) {
        pVVar18 = p->vDivSet;
        iVar5 = Vec_IntEntry(p->vObj2Var,pLeaves[uVar21]);
        Vec_IntPush(pVVar18,iVar5);
      }
    }
    if (nLeaves <= p->vDivSet->nSize) {
      __assert_fail("Vec_IntSize(p->vDivSet) < nLeaves",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x519,
                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                   );
    }
    aVar7 = Abc_Clock();
    psVar1 = p->pSat;
    iVar5 = *pFreeVar;
    *pFreeVar = iVar5 + 1;
    wVar8 = Sbd_ManSolve(psVar1,iVar3,iVar5,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
    aVar9 = Abc_Clock();
    p->timeSat = p->timeSat + (aVar9 - aVar7);
    if (wVar8 == 0x8765432187654321) {
      iVar13 = Vec_IntEntry(p->vLutLevs,pLeaves[iVar13]);
      if (-2 < iVar13 - iVar4) {
        return 0;
      }
    }
    else if (wVar8 == 0x1234567812345678) {
      printf("Node %d:  Undecided.\n",(ulong)(uint)Pivot);
    }
    else {
      pLeaves[iVar13] = -1;
    }
    uVar16 = uVar16 - 1;
  }
  for (uVar14 = 0; uVar6 != uVar14; uVar14 = uVar14 + 1) {
    if (pLeaves[uVar14] != -1) {
      Vec_IntPush(p->vDivSet,pLeaves[uVar14]);
    }
  }
  pVVar18 = p->vDivSet;
  iVar13 = pVVar18->nSize;
  if (iVar13 <= p->pPars->nLutSize) {
    *pnStrs = 1;
    for (iVar4 = 0; iVar4 < pVVar18->nSize; iVar4 = iVar4 + 1) {
      iVar13 = Vec_IntEntry(pVVar18,iVar4);
      pVVar18 = p->vDivSet;
      iVar13 = Vec_IntEntry(p->vObj2Var,iVar13);
      Vec_IntWriteEntry(pVVar18,iVar4,iVar13);
      pVVar18 = p->vDivSet;
    }
    aVar7 = Abc_Clock();
    psVar1 = p->pSat;
    iVar4 = *pFreeVar;
    *pFreeVar = iVar4 + 1;
    wVar8 = Sbd_ManSolve(psVar1,iVar3,iVar4,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
    aVar9 = Abc_Clock();
    p->timeSat = p->timeSat + (aVar9 - aVar7);
    if (wVar8 != 0x8765432187654321) {
      if (wVar8 != 0x1234567812345678) {
        Strs->fLut = 1;
        uVar16 = p->vDivSet->nSize;
        Strs->nVarIns = uVar16;
        uVar14 = 0;
        uVar6 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar6 = uVar14;
        }
        for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
          Strs->VarIns[uVar14] = (int)uVar14;
        }
        Strs->Res = wVar8;
        p->nLuts[1] = p->nLuts[1] + 1;
        return 1;
      }
      __assert_fail("Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x53e,
                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                   );
    }
    printf("The cut at node %d is not topological.\n",(ulong)(uint)p->Pivot);
    return 0;
  }
  uVar16 = 0;
  uVar23 = 0;
  uVar20 = 0;
  uVar17 = 0;
  for (iVar3 = 0; lVar22 = (long)(int)uVar20, iVar3 < iVar13; iVar3 = iVar3 + 1) {
    iVar13 = Vec_IntEntry(pVVar18,iVar3);
    iVar5 = Vec_IntEntry(p->vLutLevs,iVar13);
    iVar5 = iVar5 - iVar4;
    if (-2 < iVar5) break;
    if (iVar5 == -2) {
      piVar11 = pNodesTop;
      uVar12 = uVar17;
      uVar17 = uVar17 + 1;
    }
    else {
      uVar20 = uVar20 + 1;
      pNodesBot[lVar22] = iVar3;
      if (iVar5 == -3) {
        piVar11 = pNodesBot1;
        uVar12 = uVar16;
        uVar16 = uVar16 + 1;
      }
      else {
        piVar11 = pNodesBot2;
        uVar12 = uVar23;
        uVar23 = uVar23 + 1;
      }
    }
    piVar11[(int)uVar12] = iVar3;
    pVVar18 = p->vDivSet;
    iVar13 = Vec_IntEntry(p->vObj2Var,iVar13);
    Vec_IntWriteEntry(pVVar18,iVar3,iVar13);
    pVVar18 = p->vDivSet;
    iVar13 = pVVar18->nSize;
  }
  if (uVar20 != uVar23 + uVar16) {
    __assert_fail("nNodesBot == nNodesBot1 + nNodesBot2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x55e,
                  "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)");
  }
  pVVar18 = p->vDivSet;
  iVar4 = pVVar18->nSize;
  if (iVar4 <= iVar3) {
    pSVar10 = p->pPars;
    uVar12 = pSVar10->nLutSize;
    if ((int)uVar17 < (int)uVar12) {
      if (SBORROW4(iVar4,uVar12 * 2) != (int)(iVar4 + uVar12 * -2) < 0) {
        iVar3 = 0;
        if ((int)uVar12 < (int)uVar20) {
          piVar11 = pNodesTop + (int)uVar17;
          for (lVar24 = 0; (long)(int)uVar12 < lVar24 + lVar22; lVar24 = lVar24 + -1) {
            *piVar11 = pNodesBot[lVar22 + lVar24 + -1];
            piVar11 = piVar11 + 1;
          }
          iVar3 = (int)lVar24;
          if (uVar12 - uVar20 != iVar3) {
            __assert_fail("nNodesBot == p->pPars->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x56c,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
          uVar17 = uVar17 - iVar3;
          iVar3 = -iVar3;
          uVar20 = uVar12;
        }
        if ((int)uVar12 <= (int)uVar17) {
          __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x56f,
                        "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                       );
        }
        Strs->fLut = 1;
        Strs->nVarIns = uVar12;
        uVar14 = 0;
        uVar6 = 0;
        if (0 < (int)uVar17) {
          uVar6 = (ulong)uVar17;
        }
        for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
          Strs->VarIns[uVar14] = pNodesTop[uVar14];
        }
        for (; (long)uVar6 < (long)pSVar10->nLutSize; uVar6 = uVar6 + 1) {
          Strs->VarIns[uVar6] = (1 - uVar17) + (int)uVar6 + pVVar18->nSize;
        }
        Strs->Res = 0;
        Strs[1].fLut = 1;
        Strs[1].nVarIns = uVar20;
        uVar14 = 0;
        uVar6 = 0;
        if (0 < (int)uVar20) {
          uVar6 = (ulong)uVar20;
        }
        for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
          Strs[1].VarIns[uVar14] = pNodesBot[uVar14];
        }
        Strs[1].Res = 0;
        uVar12 = ~uVar17 + pSVar10->nLutSize;
        if (3 < uVar12) {
          __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x580,
                        "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                       );
        }
        piVar11 = Strs[2].VarIns;
        for (uVar14 = 0; uVar14 != uVar12; uVar14 = uVar14 + 1) {
          Strs[uVar14 + 2].fLut = 0;
          Strs[uVar14 + 2].nVarIns = uVar20;
          for (uVar21 = 0; uVar6 != uVar21; uVar21 = uVar21 + 1) {
            piVar11[uVar21] = pNodesBot[uVar21];
          }
          Strs[uVar14 + 2].Res = 0;
          piVar11 = piVar11 + 0xe;
        }
        *pnStrs = uVar12 + 2;
        aVar7 = Abc_Clock();
        iVar4 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,p->vRoots
                                 ,p->vDivSet,*pnStrs,Strs);
        aVar9 = Abc_Clock();
        p->timeQbf = p->timeQbf + (aVar9 - aVar7);
        if (iVar4 != 0) {
          p->nLuts[2] = p->nLuts[2] + 1;
        }
        piVar11 = pNodesTop + (long)(int)uVar17 + -1;
        for (lVar22 = 0; iVar13 = (int)lVar22, iVar3 != iVar13; lVar22 = lVar22 + 1) {
          pNodesBot[(int)uVar20 + lVar22] = *piVar11;
          piVar11 = piVar11 + -1;
        }
        if (iVar4 != 0) {
          return iVar4;
        }
        uVar20 = uVar20 + iVar13;
        uVar17 = uVar17 - iVar13;
        pSVar10 = p->pPars;
      }
      if (2 < pSVar10->nLutNum) {
        pVVar18 = p->vDivSet;
        uVar12 = pSVar10->nLutSize;
        uVar6 = (long)(int)uVar12 * 2;
        uVar2 = (uint)uVar6;
        if ((int)(uVar2 - 1) <= pVVar18->nSize) {
          if ((int)uVar17 <= (int)(uVar12 - 2)) {
            iVar3 = 0;
            lVar22 = (long)(int)uVar20;
            if ((int)uVar2 < (int)uVar20) {
              piVar11 = pNodesTop + (int)uVar17;
              for (lVar24 = 0; uVar14 = lVar22 + lVar24,
                  uVar14 != uVar6 &&
                  SBORROW8(uVar14,uVar6) == (long)(uVar14 + (long)(int)uVar12 * -2) < 0;
                  lVar24 = lVar24 + -1) {
                *piVar11 = pNodesBot[lVar22 + lVar24 + -1];
                piVar11 = piVar11 + 1;
              }
              iVar3 = (int)lVar24;
              if (uVar2 - uVar20 != iVar3) {
                __assert_fail("nNodesBot == 2*p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5a4,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              uVar17 = uVar17 - iVar3;
              iVar3 = -iVar3;
              uVar20 = uVar2;
            }
            if ((int)uVar20 <= (int)uVar12) {
              __assert_fail("nNodesBot > p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x5a6,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            if ((int)uVar2 < (int)uVar20) {
              __assert_fail("nNodesBot <= 2*p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x5a7,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            if ((int)(uVar12 - 2) < (int)uVar17) {
              __assert_fail("nNodesTop <= p->pPars->nLutSize-2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x5a8,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            Strs->fLut = 1;
            Strs->nVarIns = uVar12;
            uVar14 = 0;
            uVar6 = 0;
            if (0 < (int)uVar17) {
              uVar6 = (ulong)uVar17;
            }
            for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
              Strs->VarIns[uVar14] = pNodesTop[uVar14];
            }
            for (; uVar12 = pSVar10->nLutSize, (long)uVar6 < (long)(int)uVar12; uVar6 = uVar6 + 1) {
              Strs->VarIns[uVar6] = (1 - uVar17) + (int)uVar6 + pVVar18->nSize;
            }
            Strs->Res = 0;
            Strs[1].fLut = 1;
            Strs[1].nVarIns = uVar12;
            uVar14 = 0;
            uVar6 = (ulong)uVar12;
            if ((int)uVar12 < 1) {
              uVar6 = uVar14;
            }
            for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
              Strs[1].VarIns[uVar14] = pNodesBot[uVar14];
            }
            Strs[1].Res = 0;
            Strs[2].fLut = 1;
            uVar12 = pSVar10->nLutSize;
            Strs[2].nVarIns = uVar12;
            uVar14 = 0;
            uVar6 = (ulong)uVar12;
            if ((int)uVar12 < 1) {
              uVar6 = uVar14;
            }
            lVar24 = (long)(int)uVar2;
            if (lVar22 < (int)uVar2) {
              lVar24 = lVar22;
            }
            for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
              Strs[2].VarIns[uVar14] = pNodesBot[((int)lVar24 + (int)uVar14) - pSVar10->nLutSize];
            }
            Strs[2].Res = 0;
            iVar4 = pSVar10->nLutSize - uVar17;
            uVar12 = iVar4 - 2;
            if (2 < uVar12) {
              __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x5bf,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            piVar11 = Strs[3].VarIns;
            for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
              Strs[uVar6 + 3].fLut = 0;
              Strs[uVar6 + 3].nVarIns = uVar20;
              for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                piVar11[uVar14] = pNodesBot[uVar14];
              }
              Strs[uVar6 + 3].Res = 0;
              piVar11 = piVar11 + 0xe;
            }
            *pnStrs = iVar4 + 1;
            aVar7 = Abc_Clock();
            iVar4 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                                     p->vRoots,p->vDivSet,*pnStrs,Strs);
            aVar9 = Abc_Clock();
            p->timeQbf = p->timeQbf + (aVar9 - aVar7);
            if (iVar4 != 0) {
              p->nLuts[3] = p->nLuts[3] + 1;
            }
            piVar11 = pNodesTop + (long)(int)uVar17 + -1;
            for (lVar22 = 0; iVar3 != (int)lVar22; lVar22 = lVar22 + 1) {
              pNodesBot[(int)uVar20 + lVar22] = *piVar11;
              piVar11 = piVar11 + -1;
            }
            if (iVar4 != 0) {
              return iVar4;
            }
            uVar17 = uVar17 - (int)lVar22;
            pSVar10 = p->pPars;
            uVar12 = pSVar10->nLutSize;
            uVar6 = (ulong)(uVar12 * 2);
          }
          if ((int)uVar6 + -2 < (int)(uVar16 + uVar17)) {
            return 0;
          }
          if ((int)uVar12 < (int)uVar23) {
            piVar11 = pNodesBot1 + (int)uVar16;
            for (lVar22 = 0; (long)(int)uVar12 < (int)uVar23 + lVar22; lVar22 = lVar22 + -1) {
              *piVar11 = pNodesBot2[(long)(int)uVar23 + lVar22 + -1];
              piVar11 = piVar11 + 1;
            }
            if (uVar12 - uVar23 != (int)lVar22) {
              __assert_fail("nNodesBot2 == p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x5dd,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            uVar16 = uVar16 - (int)lVar22;
            uVar23 = uVar12;
          }
          if ((int)uVar12 <= (int)uVar16) {
            lVar22 = 0;
            for (lVar24 = (long)(int)uVar16; (int)uVar12 <= lVar24; lVar24 = lVar24 + -1) {
              pNodesTop[(int)uVar17 + lVar22] = pNodesBot1[lVar24 + -1];
              lVar22 = lVar22 + 1;
            }
            iVar3 = (int)lVar22;
            if ((uVar16 - uVar12) + 1 != iVar3) {
              __assert_fail("nNodesBot1 == p->pPars->nLutSize-1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x5e3,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            uVar17 = uVar17 + iVar3;
            uVar16 = uVar16 - iVar3;
          }
          if ((int)uVar12 < (int)uVar23) {
            __assert_fail("nNodesBot2 <= p->pPars->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x5e5,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
          if ((int)uVar12 <= (int)uVar16) {
            __assert_fail("nNodesBot1 <= p->pPars->nLutSize-1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x5e6,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
          if ((int)uVar12 <= (int)uVar17) {
            __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x5e7,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
          Strs->fLut = 1;
          Strs->nVarIns = uVar12;
          uVar14 = 0;
          uVar6 = 0;
          if (0 < (int)uVar17) {
            uVar6 = (ulong)uVar17;
          }
          for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
            Strs->VarIns[uVar14] = pNodesTop[uVar14];
          }
          pVVar18 = p->vDivSet;
          iVar3 = pVVar18->nSize + 1;
          while( true ) {
            Strs->VarIns[uVar6] = iVar3;
            iVar3 = pSVar10->nLutSize;
            if (iVar3 <= (int)uVar6 + 1) break;
            iVar3 = (3 - uVar17) + (int)uVar6 + pVVar18->nSize;
            uVar6 = uVar6 + 1;
          }
          Strs->Res = 0;
          Strs[1].fLut = 1;
          Strs[1].nVarIns = iVar3;
          uVar14 = 0;
          uVar6 = 0;
          if (0 < (int)uVar16) {
            uVar6 = (ulong)uVar16;
          }
          for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
            Strs[1].VarIns[uVar14] = pNodesBot1[uVar14];
          }
          Strs[1].VarIns[uVar6] = pVVar18->nSize + 2;
          iVar4 = (((int)uVar6 - uVar17) - uVar16) + iVar3 + 2;
          for (uVar14 = uVar6; iVar13 = pSVar10->nLutSize, (int)uVar14 + 1 < iVar13;
              uVar14 = uVar14 + 1) {
            Strs[1].VarIns[uVar14 + 1] = pVVar18->nSize + iVar4;
            iVar4 = iVar4 + 1;
          }
          Strs[1].Res = 0;
          Strs[2].fLut = 1;
          Strs[2].nVarIns = uVar23;
          uVar21 = 0;
          uVar14 = 0;
          if (0 < (int)uVar23) {
            uVar14 = (ulong)uVar23;
          }
          for (; uVar14 != uVar21; uVar21 = uVar21 + 1) {
            Strs[2].VarIns[uVar21] = pNodesBot2[uVar21];
          }
          Strs[2].Res = 0;
          uVar20 = ~uVar16 + ~uVar17 + iVar3 + iVar13;
          if (3 < uVar20) {
            __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x604,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
          piVar11 = Strs[3].VarIns;
          piVar19 = Strs[3].VarIns + (int)uVar23;
          for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
            Strs[uVar21 + 3].fLut = 0;
            Strs[uVar21 + 3].nVarIns = uVar23;
            for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
              piVar11[uVar15] = pNodesBot2[uVar15];
            }
            Strs[uVar21 + 3].Res = 0;
            if ((long)uVar21 < (long)(int)(~uVar17 + iVar3)) {
              Strs[uVar21 + 3].nVarIns = uVar16 + uVar23;
              for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
                piVar19[uVar15] = pNodesBot1[uVar15];
              }
            }
            piVar11 = piVar11 + 0xe;
            piVar19 = piVar19 + 0xe;
          }
          *pnStrs = uVar20 + 3;
          aVar7 = Abc_Clock();
          iVar3 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                                   p->vRoots,p->vDivSet,*pnStrs,Strs);
          aVar9 = Abc_Clock();
          p->timeQbf = p->timeQbf + (aVar9 - aVar7);
          if (iVar3 != 0) {
            p->nLuts[4] = p->nLuts[4] + 1;
            return iVar3;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Sbd_ManExploreCut( Sbd_Man_t * p, int Pivot, int nLeaves, int * pLeaves, int * pnStrs, Sbd_Str_t * Strs, int * pFreeVar )
{
    abctime clk = Abc_Clock();
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int Delay = Vec_IntEntry( p->vLutLevs, Pivot );
    int pNodesTop[SBD_DIV_MAX], pNodesBot[SBD_DIV_MAX], pNodesBot1[SBD_DIV_MAX], pNodesBot2[SBD_DIV_MAX];
    int nNodesTop = 0, nNodesBot = 0, nNodesBot1 = 0, nNodesBot2 = 0, nNodesDiff = 0, nNodesDiff1 = 0, nNodesDiff2 = 0;
    int i, k, iObj, nIters, RetValue = 0;

    // try to remove fanins
    for ( nIters = 0; nIters < nLeaves; nIters++ )
    {
        word Truth;
        // try to remove one variable from divisors
        Vec_IntClear( p->vDivSet );
        for ( i = 0; i < nLeaves; i++ )
            if ( i != nLeaves-1-nIters && pLeaves[i] != -1 )
                Vec_IntPush( p->vDivSet, Vec_IntEntry(p->vObj2Var, pLeaves[i]) );
        assert( Vec_IntSize(p->vDivSet) < nLeaves );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( Truth == SBD_SAT_SAT )
        {
            int DelayDiff = Vec_IntEntry(p->vLutLevs, pLeaves[nLeaves-1-nIters]) - Delay;
            if ( DelayDiff > -2 )
                return 0;
        }
        else
            pLeaves[nLeaves-1-nIters] = -1;
    }
    Vec_IntClear( p->vDivSet );
    for ( i = 0; i < nLeaves; i++ )
        if ( pLeaves[i] != -1 )
            Vec_IntPush( p->vDivSet, pLeaves[i] );
    //printf( "Reduced %d -> %d\n", nLeaves, Vec_IntSize(p->vDivSet) );
    if ( Vec_IntSize(p->vDivSet) <= p->pPars->nLutSize )
    {
        word Truth;
        *pnStrs = 1;
        // remap divisors
        Vec_IntForEachEntry( p->vDivSet, iObj, i )
            Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_SAT )
        {
            printf( "The cut at node %d is not topological.\n", p->Pivot );
            return 0;
        }
        assert( Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT );
        // create structure
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        p->nLuts[1]++;
        //Extra_PrintBinary( stdout, (unsigned *)&Truth, 1 << Strs->nVarIns ), printf( "\n" );
        return 1;
    }
    assert( Vec_IntSize(p->vDivSet) > p->pPars->nLutSize );

    // count number of nodes on each level
    nNodesTop = nNodesBot = nNodesBot1 = nNodesBot2 = 0;
    Vec_IntForEachEntry( p->vDivSet, iObj, i )
    {
        int DelayDiff = Vec_IntEntry(p->vLutLevs, iObj) - Delay;
        if ( DelayDiff > -2 )
            break;
        if ( DelayDiff == -2 )
            pNodesTop[nNodesTop++] = i;
        else // if ( DelayDiff < -2 )
        {
            pNodesBot[nNodesBot++] = i;
            if ( DelayDiff == -3 )
                pNodesBot1[nNodesBot1++] = i;
            else // if ( DelayDiff < -3 )
                pNodesBot2[nNodesBot2++] = i;
        }
        Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
    }
    assert( nNodesBot == nNodesBot1 + nNodesBot2 );
    if ( i < Vec_IntSize(p->vDivSet) )
        return 0;
    if ( nNodesTop > p->pPars->nLutSize-1 )
        return 0;

    // try 44
    if ( Vec_IntSize(p->vDivSet) <= 2*p->pPars->nLutSize-1 )
    {
        int nMoved = 0;
        if ( nNodesBot > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == p->pPars->nLutSize );
        }
        assert( nNodesBot <= p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = nNodesBot;
        for ( i = 0; i < nNodesBot; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        nNodesDiff = p->pPars->nLutSize-1 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[2+k].fLut = 0;
            Strs[2+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[2+k].VarIns[i] = pNodesBot[i];
            Strs[2+k].Res = 0;
        }

        *pnStrs = 2 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[2]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }

    if ( RetValue )
        return RetValue;
    if ( p->pPars->nLutNum < 3 )
        return 0;
    if ( Vec_IntSize(p->vDivSet) < 2*p->pPars->nLutSize-1 )
        return 0;

    // try 444 -- LUT(LUT, LUT)
    if ( nNodesTop <= p->pPars->nLutSize-2 )
    {
        int nMoved = 0;
        if ( nNodesBot > 2*p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > 2*p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == 2*p->pPars->nLutSize );
        }
        assert( nNodesBot > p->pPars->nLutSize );
        assert( nNodesBot <= 2*p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-2 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[1].nVarIns; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot[nNodesBot-p->pPars->nLutSize+i];
        Strs[2].Res = 0;

        nNodesDiff = p->pPars->nLutSize-2 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 2 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[3+k].VarIns[i] = pNodesBot[i];
            Strs[3+k].Res = 0;
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[3]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }
    if ( RetValue )
        return RetValue;

    // try 444 -- LUT(LUT(LUT))
    if ( nNodesBot1 + nNodesTop <= 2*p->pPars->nLutSize-2 )
    {
        if ( nNodesBot2 > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot2 > p->pPars->nLutSize )
                pNodesBot1[nNodesBot1++] = pNodesBot2[--nNodesBot2];
            assert( nNodesBot2 == p->pPars->nLutSize );
        }
        if ( nNodesBot1 > p->pPars->nLutSize-1 ) // need to move bottom left-over to the top
        {
            while ( nNodesBot1 > p->pPars->nLutSize-1 )
                pNodesTop[nNodesTop++] = pNodesBot1[--nNodesBot1];
            assert( nNodesBot1 == p->pPars->nLutSize-1 );
        }
        assert( nNodesBot2 <= p->pPars->nLutSize );
        assert( nNodesBot1 <= p->pPars->nLutSize-1 );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        Strs[0].VarIns[i++] = Vec_IntSize(p->vDivSet)+1;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+2 + i-nNodesTop;
        Strs[0].Res = 0;
        nNodesDiff1 = p->pPars->nLutSize-1 - nNodesTop;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesBot1; i++ )
            Strs[1].VarIns[i] = pNodesBot1[i];
        Strs[1].VarIns[i++] = Vec_IntSize(p->vDivSet)+2;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[1].VarIns[i] = Vec_IntSize(p->vDivSet)+2+nNodesDiff1 + i-nNodesBot1;
        Strs[1].Res = 0;
        nNodesDiff2 = p->pPars->nLutSize-1 - nNodesBot1;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = nNodesBot2;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot2[i];
        Strs[2].Res = 0;

        nNodesDiff = nNodesDiff1 + nNodesDiff2;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot2;
            for ( i = 0; i < nNodesBot2; i++ )
                Strs[3+k].VarIns[i] = pNodesBot2[i];
            Strs[3+k].Res = 0;
            if ( k >= nNodesDiff1 )
                continue;
            Strs[3+k].nVarIns += nNodesBot1;
            for ( i = 0; i < nNodesBot1; i++ )
                Strs[3+k].VarIns[nNodesBot2 + i] = pNodesBot1[i];
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[4]++;
    }
    return RetValue;
}